

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

void __thiscall DataRefs::SetAircraftDisplayed(DataRefs *this,int bEnable)

{
  bool bVar1;
  uint uVar2;
  
  if (bEnable == 0) {
    LTMainHideAircraft();
    uVar2 = 0;
  }
  else {
    bVar1 = LTMainShowAircraft();
    uVar2 = (uint)bVar1;
  }
  this->bShowingAircraft = uVar2;
  MenuUpdateAllItemStatus();
  return;
}

Assistant:

void DataRefs::SetAircraftDisplayed ( int bEnable )
{
    // Do what we are asked to do
    if ( bEnable )
    {
        bShowingAircraft = LTMainShowAircraft();
    }
    else
    {
        LTMainHideAircraft();
        bShowingAircraft = 0;
    }
    
    // update menu item's checkmark
    MenuUpdateAllItemStatus();
}